

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O3

int AF_A_SerpentHumpDecide(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  FState *pFVar7;
  AActor *this;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  FSoundID local_30;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e9124;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005e9114;
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_005e8f68;
    pPVar6 = (this->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (this->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar9 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar9;
    bVar10 = pPVar6 == pPVar3;
    if (!bVar10 && !bVar9) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
    uVar5 = (uint)bVar9;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005e9124;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_005e9114;
LAB_005e8f68:
    this = (AActor *)0x0;
    pVVar8 = param;
    uVar5 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005e9114:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005e9124;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar6 = (PClass *)puVar2[1];
          if (pPVar6 == (PClass *)0x0) {
            pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar5,ret);
            puVar2[1] = pPVar6;
          }
          bVar9 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar3 && bVar9) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar9 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar3) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if (!bVar9) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005e9124;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005e9114;
    }
    if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005e9124:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0x59,
                    "int AF_A_SerpentHumpDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  pFVar7 = this->MissileState;
  uVar5 = FRandom::GenRand32(&pr_serpenthump);
  if (pFVar7 == (FState *)0x0) {
    if ((uVar5 & 0xfc) != 0) {
      return 0;
    }
  }
  else {
    if (0x1e < (uVar5 & 0xff)) {
      return 0;
    }
    uVar5 = FRandom::GenRand32(&pr_serpenthump);
    if ((uVar5 & 0xf8) < 0x28) goto LAB_005e9096;
  }
  bVar9 = AActor::CheckMeleeRange(this);
  if (bVar9) {
    return 0;
  }
  if ((this->MissileState == (FState *)0x0) ||
     (uVar5 = FRandom::GenRand32(&pr_serpenthump), (char)uVar5 < '\0')) {
    local_2c.Index = FName::NameManager::FindName(&FName::NameData,"Hump",false);
    pFVar7 = AActor::FindState(this,&local_2c);
    AActor::SetState(this,pFVar7,false);
    local_30.ID = S_FindSound("SerpentActive");
    S_Sound(this,4,&local_30,1.0,1.0);
    return 0;
  }
LAB_005e9096:
  AActor::SetState(this,this->MeleeState,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentHumpDecide)
{
	PARAM_ACTION_PROLOGUE;

	if (self->MissileState != NULL)
	{
		if (pr_serpenthump() > 30)
		{
			return 0;
		}
		else if (pr_serpenthump() < 40)
		{ // Missile attack
			self->SetState (self->MeleeState);
			return 0;
		}
	}
	else if (pr_serpenthump() > 3)
	{
		return 0;
	}
	if (!self->CheckMeleeRange ())
	{ // The hump shouldn't occur when within melee range
		if (self->MissileState != NULL && pr_serpenthump() < 128)
		{
			self->SetState (self->MeleeState);
		}
		else
		{	
			self->SetState (self->FindState ("Hump"));
			S_Sound (self, CHAN_BODY, "SerpentActive", 1, ATTN_NORM);
		}
	}
	return 0;
}